

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureImmutableLevelsCase::test
          (TextureImmutableLevelsCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestLog *pTVar2;
  GLenum GVar3;
  GLsizei depth;
  undefined8 *puVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  int levels;
  ulong uVar8;
  undefined8 uVar9;
  ScopedLogSection section;
  GLuint textureID;
  ScopedLogSection section_1;
  string local_250;
  string local_230;
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  string local_1f0;
  GLuint local_1cc;
  ResultCollector *local_1c8;
  code *local_1c0;
  GLenum local_1b8;
  ScopedLogSection local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  local_1c8 = result;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Initial","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Initial","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_230,pTVar2,local_1a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (local_1c8,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
             (this->super_TextureTest).m_type);
  tcu::TestLog::endSection((TestLog *)local_230._M_dataplus._M_p);
  if (((this->super_TextureTest).m_target | 2) != 0x9102) {
    paVar1 = &local_230.field_2;
    levels = 1;
    do {
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Levels","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::operator<<(local_1a8,levels);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,0x1cf9797);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 == paVar6) {
        local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_230.field_2._8_8_ = puVar4[3];
        local_230._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_230._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_230._M_string_length = puVar4[1];
      *puVar4 = paVar6;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection(&local_1b0,pTVar2,&local_250,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != paVar1) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_1cc = 0;
      glu::CallLogWrapper::glGenTextures(gl,1,&local_1cc);
      glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_1cc);
      GVar3 = glu::CallLogWrapper::glGetError(gl);
      if (GVar3 != 0) {
        local_210 = local_200;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Got Error ","");
        local_1c0 = glu::getErrorName;
        local_1b8 = GVar3;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1f0,&local_1c0);
        uVar8 = 0xf;
        if (local_210 != local_200) {
          uVar8 = local_200[0];
        }
        if (uVar8 < local_1f0._M_string_length + local_208) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            uVar9 = local_1f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_1f0._M_string_length + local_208) goto LAB_01875974;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
        }
        else {
LAB_01875974:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_210,(ulong)local_1f0._M_dataplus._M_p);
        }
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 == paVar6) {
          local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_230.field_2._8_8_ = puVar4[3];
          local_230._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_230._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_230._M_string_length = puVar4[1];
        *puVar4 = paVar6;
        puVar4[1] = 0;
        paVar6->_M_local_buf[0] = '\0';
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_250.field_2._M_allocated_capacity = *psVar7;
          local_250.field_2._8_8_ = plVar5[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar7;
          local_250._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_250._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1a8[0].field_2._0_8_ = *psVar7;
          local_1a8[0].field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar7;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8[0]._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ResultCollector::fail(local_1c8,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
      }
      GVar3 = (this->super_TextureTest).m_target;
      depth = 0x40;
      if ((int)GVar3 < 0x8513) {
        if (GVar3 == 0xde1) {
LAB_01875b7b:
          glu::CallLogWrapper::glTexStorage2D(gl,GVar3,levels,0x8051,0x40,0x40);
        }
        else if (GVar3 == 0x806f) goto LAB_01875b9d;
      }
      else {
        if (GVar3 == 0x9009) {
          depth = 0xc;
        }
        else if (GVar3 != 0x8c1a) {
          if (GVar3 != 0x8513) goto LAB_01875bbb;
          goto LAB_01875b7b;
        }
LAB_01875b9d:
        glu::CallLogWrapper::glTexStorage3D(gl,GVar3,levels,0x8051,0x40,0x40,depth);
      }
LAB_01875bbb:
      GVar3 = glu::CallLogWrapper::glGetError(gl);
      if (GVar3 != 0) {
        local_210 = local_200;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Got Error ","");
        local_1c0 = glu::getErrorName;
        local_1b8 = GVar3;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1f0,&local_1c0);
        uVar8 = 0xf;
        if (local_210 != local_200) {
          uVar8 = local_200[0];
        }
        if (uVar8 < local_1f0._M_string_length + local_208) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            uVar9 = local_1f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_1f0._M_string_length + local_208) goto LAB_01875c6e;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
        }
        else {
LAB_01875c6e:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_210,(ulong)local_1f0._M_dataplus._M_p);
        }
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 == paVar6) {
          local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_230.field_2._8_8_ = puVar4[3];
          local_230._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_230._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_230._M_string_length = puVar4[1];
        *puVar4 = paVar6;
        puVar4[1] = 0;
        paVar6->_M_local_buf[0] = '\0';
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_250.field_2._M_allocated_capacity = *psVar7;
          local_250.field_2._8_8_ = plVar5[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar7;
          local_250._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_250._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1a8[0].field_2._0_8_ = *psVar7;
          local_1a8[0].field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar7;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8[0]._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ResultCollector::fail(local_1c8,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_1c8,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 levels,(this->super_TextureTest).m_type);
      glu::CallLogWrapper::glDeleteTextures(gl,1,&local_1cc);
      GVar3 = glu::CallLogWrapper::glGetError(gl);
      if (GVar3 != 0) {
        local_210 = local_200;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Got Error ","");
        local_1c0 = glu::getErrorName;
        local_1b8 = GVar3;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1f0,&local_1c0);
        uVar8 = 0xf;
        if (local_210 != local_200) {
          uVar8 = local_200[0];
        }
        if (uVar8 < local_1f0._M_string_length + local_208) {
          uVar9 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            uVar9 = local_1f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar9 < local_1f0._M_string_length + local_208) goto LAB_01875f22;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
        }
        else {
LAB_01875f22:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_210,(ulong)local_1f0._M_dataplus._M_p);
        }
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 == paVar6) {
          local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_230.field_2._8_8_ = puVar4[3];
          local_230._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_230.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_230._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_230._M_string_length = puVar4[1];
        *puVar4 = paVar6;
        puVar4[1] = 0;
        paVar6->_M_local_buf[0] = '\0';
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_250.field_2._M_allocated_capacity = *psVar7;
          local_250.field_2._8_8_ = plVar5[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar7;
          local_250._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_250._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1a8[0].field_2._0_8_ = *psVar7;
          local_1a8[0].field_2._8_8_ = plVar5[3];
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar7;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_1a8[0]._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ResultCollector::fail(local_1c8,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar1) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
        }
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
      }
      tcu::TestLog::endSection(local_1b0.m_log);
      levels = levels + 1;
      if (levels == 8) {
        return;
      }
    } while( true );
  }
  pTVar2 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Level","");
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Level","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1b0,pTVar2,local_1a8,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_1cc = 0;
  glu::CallLogWrapper::glGenTextures(gl,1,&local_1cc);
  glu::CallLogWrapper::glBindTexture(gl,(this->super_TextureTest).m_target,local_1cc);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Got Error ","");
    local_1c0 = glu::getErrorName;
    local_1b8 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1f0,&local_1c0);
    uVar8 = 0xf;
    if (local_210 != local_200) {
      uVar8 = local_200[0];
    }
    if (uVar8 < local_1f0._M_string_length + local_208) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        uVar9 = local_1f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_1f0._M_string_length + local_208) goto LAB_01875731;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_01875731:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0._M_dataplus._M_p)
      ;
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar1) {
      local_230.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_230.field_2._8_8_ = puVar4[3];
    }
    else {
      local_230.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_230._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_230._M_string_length = puVar4[1];
    *puVar4 = paVar1;
    puVar4[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_250.field_2._M_allocated_capacity = *psVar7;
      local_250.field_2._8_8_ = plVar5[3];
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar7;
      local_250._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_250._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1a8[0].field_2._0_8_ = *psVar7;
      local_1a8[0].field_2._8_8_ = plVar5[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar7;
      local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1a8[0]._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(local_1c8,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
  }
  GVar3 = (this->super_TextureTest).m_target;
  if (GVar3 == 0x9102) {
    glu::CallLogWrapper::glTexStorage3DMultisample(gl,0x9102,2,0x8051,0x40,0x40,2,'\0');
  }
  else if (GVar3 == 0x9100) {
    glu::CallLogWrapper::glTexStorage2DMultisample(gl,0x9100,2,0x8051,0x40,0x40,'\0');
  }
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 != 0) {
    local_210 = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Got Error ","");
    local_1c0 = glu::getErrorName;
    local_1b8 = GVar3;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1f0,&local_1c0);
    uVar8 = 0xf;
    if (local_210 != local_200) {
      uVar8 = local_200[0];
    }
    if (uVar8 < local_1f0._M_string_length + local_208) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        uVar9 = local_1f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_1f0._M_string_length + local_208) goto LAB_018763d1;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_018763d1:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0._M_dataplus._M_p)
      ;
    }
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar1) {
      local_230.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_230.field_2._8_8_ = puVar4[3];
    }
    else {
      local_230.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_230._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_230._M_string_length = puVar4[1];
    *puVar4 = paVar1;
    puVar4[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_250.field_2._M_allocated_capacity = *psVar7;
      local_250.field_2._8_8_ = plVar5[3];
    }
    else {
      local_250.field_2._M_allocated_capacity = *psVar7;
      local_250._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_250._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    psVar7 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1a8[0].field_2._0_8_ = *psVar7;
      local_1a8[0].field_2._8_8_ = plVar5[3];
    }
    else {
      local_1a8[0].field_2._0_8_ = *psVar7;
      local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_1a8[0]._M_string_length = plVar5[1];
    *plVar5 = (long)psVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    tcu::ResultCollector::fail(local_1c8,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (local_1c8,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,1,
             (this->super_TextureTest).m_type);
  glu::CallLogWrapper::glDeleteTextures(gl,1,&local_1cc);
  GVar3 = glu::CallLogWrapper::glGetError(gl);
  if (GVar3 == 0) goto LAB_01876835;
  local_210 = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"Got Error ","");
  local_1c0 = glu::getErrorName;
  local_1b8 = GVar3;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1f0,&local_1c0);
  uVar8 = 0xf;
  if (local_210 != local_200) {
    uVar8 = local_200[0];
  }
  if (uVar8 < local_1f0._M_string_length + local_208) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      uVar9 = local_1f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_1f0._M_string_length + local_208) goto LAB_0187666e;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_210);
  }
  else {
LAB_0187666e:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1f0._M_dataplus._M_p);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 == paVar1) {
    local_230.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_230.field_2._8_8_ = puVar4[3];
  }
  else {
    local_230.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_230._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_230._M_string_length = puVar4[1];
  *puVar4 = paVar1;
  puVar4[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_230);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_250.field_2._M_allocated_capacity = *psVar7;
    local_250.field_2._8_8_ = plVar5[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar7;
    local_250._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_250._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_1a8[0].field_2._0_8_ = *psVar7;
    local_1a8[0].field_2._8_8_ = plVar5[3];
  }
  else {
    local_1a8[0].field_2._0_8_ = *psVar7;
    local_1a8[0]._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_1a8[0]._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  tcu::ResultCollector::fail(local_1c8,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (local_210 != local_200) {
    operator_delete(local_210,local_200[0] + 1);
  }
LAB_01876835:
  tcu::TestLog::endSection(local_1b0.m_log);
  return;
}

Assistant:

void TextureImmutableLevelsCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
	}

	if (m_target == GL_TEXTURE_2D_MULTISAMPLE		||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		// no levels
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Level", "Level");
		GLuint						textureID	= 0;

		gl.glGenTextures(1, &textureID);
		gl.glBindTexture(m_target, textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

		if (m_target == GL_TEXTURE_2D_MULTISAMPLE)
			gl.glTexStorage2DMultisample(m_target, 2, GL_RGB8, 64, 64, GL_FALSE);
		else if (m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
			gl.glTexStorage3DMultisample(m_target, 2, GL_RGB8, 64, 64, 2, GL_FALSE);
		else
			DE_ASSERT(false);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexStorage");

		verifyStateTextureParamInteger(result, gl, m_target, m_pname, 1, m_type);

		gl.glDeleteTextures(1, &textureID);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
	}
	else
	{
		for (int level = 1; level <= 7; ++level)
		{
			const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Levels", "Levels = " + de::toString(level));
			GLuint						textureID	= 0;

			gl.glGenTextures(1, &textureID);
			gl.glBindTexture(m_target, textureID);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glBindTexture");

			if (m_target == GL_TEXTURE_2D || m_target == GL_TEXTURE_CUBE_MAP)
				gl.glTexStorage2D(m_target, level, GL_RGB8, 64, 64);
			else if (m_target == GL_TEXTURE_2D_ARRAY || m_target == GL_TEXTURE_3D)
				gl.glTexStorage3D(m_target, level, GL_RGB8, 64, 64, 64);
			else if (m_target == GL_TEXTURE_CUBE_MAP_ARRAY)
				gl.glTexStorage3D(m_target, level, GL_RGB8, 64, 64, 6 * 2);
			else
				DE_ASSERT(false);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexStorage");

			verifyStateTextureParamInteger(result, gl, m_target, m_pname, level, m_type);

			gl.glDeleteTextures(1, &textureID);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glDeleteTextures");
		}
	}
}